

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

char * mpack_expect_cstr_alloc(mpack_reader_t *reader,size_t maxsize)

{
  _Bool _Var1;
  size_t in_RAX;
  char *str;
  size_t length;
  
  length = in_RAX;
  str = mpack_expect_cstr_alloc_unchecked(reader,maxsize,&length);
  if (str != (char *)0x0) {
    _Var1 = mpack_str_check_no_null(str,length);
    if (_Var1) {
      return str;
    }
    free(str);
    mpack_reader_flag_error(reader,mpack_error_type);
  }
  return (char *)0x0;
}

Assistant:

char* mpack_expect_cstr_alloc(mpack_reader_t* reader, size_t maxsize) {
    size_t length;
    char* str = mpack_expect_cstr_alloc_unchecked(reader, maxsize, &length);

    if (str && !mpack_str_check_no_null(str, length)) {
        MPACK_FREE(str);
        mpack_reader_flag_error(reader, mpack_error_type);
        return NULL;
    }

    return str;
}